

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

Value * cmFileAPI::BuildVersion(Value *__return_storage_ptr__,uint major,uint minor)

{
  Value *pVVar1;
  Value VStack_68;
  Value local_40;
  
  Json::Value::Value(__return_storage_ptr__,nullValue);
  Json::Value::Value(&local_40,major);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"major");
  Json::Value::operator=(pVVar1,&local_40);
  Json::Value::~Value(&local_40);
  Json::Value::Value(&VStack_68,minor);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"minor");
  Json::Value::operator=(pVVar1,&VStack_68);
  Json::Value::~Value(&VStack_68);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildVersion(unsigned int major, unsigned int minor)
{
  Json::Value version;
  version["major"] = major;
  version["minor"] = minor;
  return version;
}